

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O2

lineiter_t * lineiter_next(lineiter_t *li)

{
  int iVar1;
  lineiter_t *li_00;
  char *pcVar2;
  
  iVar1 = li->clean;
  li_00 = lineiter_next_plain(li);
  if (iVar1 != 0) {
    for (; li_00 != (lineiter_t *)0x0; li_00 = lineiter_next_plain(li_00)) {
      if (li_00->buf != (char *)0x0) {
        pcVar2 = string_trim(li_00->buf,STRING_BOTH);
        li_00->buf = pcVar2;
        if ((*pcVar2 != '#') && (*pcVar2 != '\0')) {
          return li_00;
        }
      }
    }
    li_00 = (lineiter_t *)0x0;
  }
  return li_00;
}

Assistant:

lineiter_t *
lineiter_next(lineiter_t *li)
{
    if (!li->clean)
	return lineiter_next_plain(li);
    
    for (li = lineiter_next_plain(li); li; li = lineiter_next_plain(li)) {
	if (li->buf) {
	    li->buf = string_trim(li->buf, STRING_BOTH);
	    if (li->buf[0] != 0 && li->buf[0] != '#')
		break;
	}
    }
    return li;
}